

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fpackutil.c
# Opt level: O0

void fp_abort_output(fitsfile *infptr,fitsfile *outfptr,int stat)

{
  char local_228 [8];
  char msg [513];
  int hdunum;
  int status;
  int stat_local;
  fitsfile *outfptr_local;
  fitsfile *infptr_local;
  
  stack0xffffffffffffffe0 = 0;
  if (infptr == (fitsfile *)0x0) {
    snprintf(local_228,0x201,"Error: Unable to process input file\n");
    fp_msg(local_228);
  }
  else {
    ffflnm(infptr,tempfilename,msg + 0x200);
    ffghdn(infptr,msg + 0x1fc);
    ffclos(infptr,msg + 0x200);
    snprintf(local_228,0x201,"Error processing file: %s\n",tempfilename);
    fp_msg(local_228);
    snprintf(local_228,0x201,"  in HDU number %d\n",(ulong)(uint)msg._508_4_);
    fp_msg(local_228);
  }
  ffrprt(_stderr,stat);
  if (outfptr != (fitsfile *)0x0) {
    ffdelt(outfptr,msg + 0x200);
    fp_msg("Input file is unchanged.\n");
  }
  exit(stat);
}

Assistant:

void fp_abort_output (fitsfile *infptr, fitsfile *outfptr, int stat)
{
	int status = 0, hdunum;
	char  msg[SZ_STR];

        if (infptr)
        {
	   fits_file_name(infptr, tempfilename, &status);
	   fits_get_hdu_num(infptr, &hdunum);

           fits_close_file (infptr, &status);

	   snprintf(msg, SZ_STR,"Error processing file: %s\n", tempfilename);
	   fp_msg (msg);
	   snprintf(msg, SZ_STR,"  in HDU number %d\n", hdunum);
	   fp_msg (msg);
        }
        else
        {
           snprintf(msg, SZ_STR,"Error: Unable to process input file\n");
           fp_msg(msg);
        }
	fits_report_error (stderr, stat);

	if (outfptr) {
	    fits_delete_file(outfptr, &status);
	    fp_msg ("Input file is unchanged.\n");
	}

	exit (stat); 
}